

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

void __thiscall
spirv_cross::SPIREntryPoint::SPIREntryPoint
          (SPIREntryPoint *this,FunctionID self_,ExecutionModel execution_model,string *entry_name)

{
  string *entry_name_local;
  ExecutionModel execution_model_local;
  SPIREntryPoint *this_local;
  FunctionID self__local;
  
  (this->self).id = self_.id;
  ::std::__cxx11::string::string((string *)&this->name,(string *)entry_name);
  ::std::__cxx11::string::string((string *)&this->orig_name,(string *)entry_name);
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::SmallVector
            (&this->interface_variables);
  Bitset::Bitset(&this->flags);
  WorkgroupSize::WorkgroupSize(&this->workgroup_size);
  this->invocations = 0;
  this->output_vertices = 0;
  this->output_primitives = 0;
  this->model = execution_model;
  this->geometry_passthrough = false;
  return;
}

Assistant:

SPIREntryPoint(FunctionID self_, spv::ExecutionModel execution_model, const std::string &entry_name)
	    : self(self_)
	    , name(entry_name)
	    , orig_name(entry_name)
	    , model(execution_model)
	{
	}